

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  OffsetData *offset_data;
  EXRHeader *exr_header;
  pointer pvVar1;
  long *plVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong *puVar17;
  ulong uVar18;
  bool bVar19;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  int local_ec;
  int local_e8;
  string local_d8;
  uchar *local_b8;
  int local_ac;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_a8;
  ulong local_90;
  ulong local_88;
  EXRImage *local_80;
  pointer local_78;
  ulong local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  local_b8 = memory;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    pcVar12 = "Invalid argument for LoadEXRMultipartImageFromMemory()";
    pcVar9 = "";
LAB_0021e102:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar12,pcVar9);
    _Var4._M_p = local_d8._M_dataplus._M_p;
    if (err != (char **)0x0) {
      pcVar9 = strdup(local_d8._M_dataplus._M_p);
      *err = pcVar9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != &local_d8.field_2) {
      operator_delete(_Var4._M_p);
    }
    local_e8 = -3;
  }
  else {
    local_90 = (ulong)num_parts;
    uVar6 = 0;
    lVar11 = 0;
    do {
      if ((ulong)exr_headers[uVar6]->header_len == 0) {
        pcVar12 = "EXRHeader variable is not initialized.";
        pcVar9 = "";
        goto LAB_0021e102;
      }
      lVar11 = lVar11 + (ulong)exr_headers[uVar6]->header_len;
      uVar6 = uVar6 + 1;
    } while (local_90 != uVar6);
    local_a8.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80 = exr_images;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&local_a8,local_90);
    puVar17 = (ulong *)(local_b8 + lVar11 + 9);
    local_e8 = -3;
    bVar19 = true;
    uVar6 = 0;
    do {
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                (&local_a8,
                 ((long)local_a8.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_a8.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      offset_data = local_a8.
                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -1;
      exr_header = exr_headers[uVar6];
      if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
        tinyexr::InitSingleResolutionOffsets(offset_data,(long)exr_header->chunk_count);
        plVar2 = *(long **)&(((offset_data->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl;
        lVar11 = *plVar2;
        lVar13 = plVar2[1] - lVar11;
        if (lVar13 != 0) {
          lVar13 = lVar13 >> 3;
          lVar16 = 0;
LAB_0021e0af:
          if (*puVar17 < size) goto code_r0x0021e0bc;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"Invalid offset size in EXR header chunks.","");
LAB_0021e17b:
          _Var4._M_p = local_d8._M_dataplus._M_p;
          if (err != (char **)0x0) {
            pcVar9 = strdup(local_d8._M_dataplus._M_p);
            *err = pcVar9;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var4._M_p != &local_d8.field_2) {
            operator_delete(_Var4._M_p);
          }
          local_e8 = -4;
          if (!bVar19) break;
          goto LAB_0021e376;
        }
      }
      else {
        local_78 = local_a8.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_88 = uVar6;
        local_70 = size;
        tinyexr::PrecalculateTileInfo(&local_48,&local_68,exr_header);
        uVar6 = local_88;
        iVar5 = tinyexr::InitTileOffsets
                          (offset_data,
                           (EXRHeader *)(ulong)(uint)exr_headers[local_88]->tile_level_mode,
                           &local_48,&local_68);
        size = local_70;
        local_ac = exr_headers[uVar6]->chunk_count;
        if (iVar5 != local_ac) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"Invalid offset table size.","");
          _Var4._M_p = local_d8._M_dataplus._M_p;
          if (err != (char **)0x0) {
            pcVar9 = strdup(local_d8._M_dataplus._M_p);
            *err = pcVar9;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var4._M_p != &local_d8.field_2) {
            operator_delete(_Var4._M_p);
          }
          local_e8 = -4;
        }
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (iVar5 != local_ac) goto LAB_0021e376;
        pvVar1 = local_78[-1].offsets.
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = (long)local_78[-1].offsets.
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
        if (lVar11 != 0) {
          uVar7 = (lVar11 >> 3) * -0x5555555555555555;
          uVar10 = 0;
          do {
            lVar11 = *(long *)&pvVar1[uVar10].
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl;
            lVar13 = (long)*(pointer *)
                            ((long)&pvVar1[uVar10].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl + 8) - lVar11;
            if (lVar13 != 0) {
              uVar14 = (lVar13 >> 3) * -0x5555555555555555;
              uVar15 = 0;
              do {
                lVar13 = *(long *)(lVar11 + uVar15 * 0x18);
                lVar16 = *(long *)(lVar11 + 8 + uVar15 * 0x18) - lVar13;
                if (lVar16 != 0) {
                  uVar6 = 0;
                  uVar8 = 1;
                  do {
                    if (size <= *puVar17) {
                      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_d8,"Invalid offset size in EXR header chunks.","")
                      ;
                      goto LAB_0021e17b;
                    }
                    *(ulong *)(lVar13 + uVar6 * 8) = *puVar17 + 4;
                    puVar17 = puVar17 + 1;
                    bVar3 = uVar8 < (ulong)(lVar16 >> 3);
                    uVar6 = uVar8;
                    uVar8 = (ulong)((int)uVar8 + 1);
                  } while (bVar3);
                }
                uVar15 = (ulong)((int)uVar15 + 1);
                uVar6 = local_88;
              } while (uVar15 <= uVar14 && uVar14 - uVar15 != 0);
            }
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
        }
      }
LAB_0021e0d0:
      uVar6 = uVar6 + 1;
      bVar19 = uVar6 < local_90;
    } while (uVar6 != local_90);
    uVar6 = 0;
    local_ec = local_e8;
    do {
      pvVar1 = local_a8.
               super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl
               .super__Vector_impl_data._M_start[uVar6].offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)local_a8.
                     super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].offsets.
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
      if (lVar11 != 0) {
        uVar7 = (lVar11 >> 3) * -0x5555555555555555;
        uVar10 = 0;
        do {
          lVar11 = *(long *)&pvVar1[uVar10].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl;
          lVar13 = (long)*(pointer *)
                          ((long)&pvVar1[uVar10].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl + 8) - lVar11;
          if (lVar13 != 0) {
            uVar14 = (lVar13 >> 3) * -0x5555555555555555;
            uVar15 = 0;
            do {
              lVar13 = *(long *)(lVar11 + uVar15 * 0x18);
              lVar16 = *(long *)(lVar11 + 8 + uVar15 * 0x18) - lVar13;
              if (lVar16 != 0) {
                uVar8 = 0;
                uVar18 = 1;
                do {
                  if (uVar6 != *(uint *)(local_b8 + *(long *)(lVar13 + uVar8 * 8) + -4)) {
                    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_d8,"Invalid `part number\' in EXR header chunks.",""
                              );
                    _Var4._M_p = local_d8._M_dataplus._M_p;
                    if (err != (char **)0x0) {
                      pcVar9 = strdup(local_d8._M_dataplus._M_p);
                      *err = pcVar9;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var4._M_p != &local_d8.field_2) {
                      operator_delete(_Var4._M_p);
                    }
                    local_e8 = -4;
                    goto LAB_0021e376;
                  }
                  bVar19 = uVar18 < (ulong)(lVar16 >> 3);
                  uVar8 = uVar18;
                  uVar18 = (ulong)((int)uVar18 + 1);
                } while (bVar19);
              }
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (uVar15 <= uVar14 && uVar14 - uVar15 != 0);
          }
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      iVar5 = tinyexr::DecodeChunk
                        (local_80 + uVar6,exr_headers[uVar6],
                         local_a8.
                         super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar6,local_b8,size,&local_d8);
      _Var4._M_p = local_d8._M_dataplus._M_p;
      if (((iVar5 != 0) && (local_ec = iVar5, err != (char **)0x0)) &&
         (local_d8._M_string_length != 0)) {
        pcVar9 = strdup(local_d8._M_dataplus._M_p);
        *err = pcVar9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != &local_d8.field_2) {
        operator_delete(_Var4._M_p);
      }
      if (iVar5 != 0) {
        local_e8 = local_ec;
        break;
      }
      uVar6 = uVar6 + 1;
      local_e8 = 0;
    } while (uVar6 != local_90);
LAB_0021e376:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&local_a8);
  }
  return local_e8;
code_r0x0021e0bc:
  *(ulong *)(lVar11 + lVar16 * 8) = *puVar17 + 4;
  puVar17 = puVar17 + 1;
  lVar16 = lVar16 + 1;
  if (lVar13 + (ulong)(lVar13 == 0) == lVar16) goto LAB_0021e0d0;
  goto LAB_0021e0af;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}